

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O3

bool __thiscall QSqlTableModel::updateRowInTable(QSqlTableModel *this,int row,QSqlRecord *values)

{
  QSqlDatabase *this_00;
  QSqlTableModelPrivate *this_01;
  QExplicitlySharedDataPointer<QSqlErrorPrivate> QVar1;
  bool bVar2;
  int iVar3;
  QSqlDriver *pQVar4;
  QString *pQVar5;
  long *plVar6;
  QArrayData **ppQVar7;
  long in_FS_OFFSET;
  QLatin1String QVar8;
  QByteArrayView QVar9;
  QSqlRecord whereValues;
  QSqlRecord rec;
  QString local_e8;
  QString local_c8;
  QSqlError local_b0;
  QArrayData *local_a8;
  undefined8 uStack_a0;
  long local_98;
  QArrayData *local_88;
  QArrayData **ppQStack_80;
  QArrayData *local_78;
  undefined1 local_68 [8];
  undefined1 local_60 [16];
  QArrayData **ppQStack_50;
  QArrayData *pQStack_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QSqlTableModelPrivate **)&(this->super_QSqlQueryModel).field_0x8;
  local_60._0_8_ = 0xaaaaaaaaaaaaaaaa;
  QSqlRecord::QSqlRecord((QSqlRecord *)(local_68 + 8),values);
  ppQStack_50 = &local_88;
  local_88 = (QArrayData *)CONCAT44(local_88._4_4_,row);
  local_60._8_8_ = (QArrayData *)0x0;
  pQStack_48 = (QArrayData *)(local_68 + 8);
  QMetaObject::activate((QObject *)this,&staticMetaObject,2,(void **)(local_60 + 8));
  local_68 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
  primaryValues((QSqlTableModel *)local_68,(int)this);
  this_00 = &this_01->db;
  pQVar4 = QSqlDatabase::driver(this_00);
  bVar2 = (bool)(**(code **)(*(long *)pQVar4 + 0xb8))(pQVar4,4);
  local_78 = (QArrayData *)0xaaaaaaaaaaaaaaaa;
  local_88 = (QArrayData *)0xaaaaaaaaaaaaaaaa;
  ppQStack_80 = (QArrayData **)0xaaaaaaaaaaaaaaaa;
  pQVar4 = QSqlDatabase::driver(this_00);
  (**(code **)(*(long *)pQVar4 + 0xa8))(&local_88,pQVar4,2,&this_01->tableName,local_68 + 8,bVar2);
  local_98 = -0x5555555555555556;
  local_a8 = (QArrayData *)0xaaaaaaaaaaaaaaaa;
  uStack_a0 = 0xaaaaaaaaaaaaaaaa;
  pQVar4 = QSqlDatabase::driver(this_00);
  (**(code **)(*(long *)pQVar4 + 0xa8))(&local_a8,pQVar4,0,&this_01->tableName,local_68,bVar2);
  if (((local_78 != (QArrayData *)0x0) && (-1 < row)) && (local_98 != 0)) {
    local_60._8_8_ = (QArrayData *)0xffffffffffffffff;
    ppQStack_50 = (QArrayData **)0x0;
    pQStack_48 = (QArrayData *)0x0;
    iVar3 = (**(code **)(*(long *)&this->super_QSqlQueryModel + 0x78))();
    if (row < iVar3) {
      ppQVar7 = &local_a8;
      if ((local_78 == (QArrayData *)0x0) || (ppQVar7 = &local_88, local_98 == 0)) {
        local_c8.d.d = (Data *)*ppQVar7;
        local_c8.d.ptr = (char16_t *)ppQVar7[1];
        local_c8.d.size = (qsizetype)ppQVar7[2];
        if ((QArrayData *)local_c8.d.d != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)local_c8.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
               (((QArrayData *)local_c8.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
      }
      else {
        local_60._8_8_ = local_88;
        ppQStack_50 = ppQStack_80;
        pQStack_48 = local_78;
        if (local_88 != (QArrayData *)0x0) {
          LOCK();
          (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_88->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QVar8.m_data = (char *)0x1;
        QVar8.m_size = (qsizetype)(local_60 + 8);
        pQVar5 = (QString *)QString::append(QVar8);
        plVar6 = (long *)QString::append(pQVar5);
        local_c8.d.d = (Data *)*plVar6;
        local_c8.d.ptr = (char16_t *)plVar6[1];
        local_c8.d.size = plVar6[2];
        if ((QArrayData *)local_c8.d.d != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)local_c8.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
               (((QArrayData *)local_c8.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        if ((QArrayData *)local_60._8_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_60._8_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_60._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_60._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_60._8_8_,2,0x10);
          }
        }
      }
      bVar2 = QSqlTableModelPrivate::exec
                        (this_01,&local_c8,bVar2,(QSqlRecord *)(local_68 + 8),(QSqlRecord *)local_68
                        );
      if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,0x10);
        }
      }
      goto LAB_0013ab3c;
    }
  }
  QVar9.m_data = (storage_type *)0x13;
  QVar9.m_size = (qsizetype)(local_60 + 8);
  QString::fromLatin1(QVar9);
  local_c8.d.d = (Data *)local_60._8_8_;
  local_c8.d.ptr = (char16_t *)ppQStack_50;
  local_c8.d.size = (qsizetype)pQStack_48;
  pQStack_48 = (QArrayData *)0x0;
  local_60._8_8_ = (QArrayData *)0x0;
  ppQStack_50 = (QArrayData **)0x0;
  local_e8.d.size = 0;
  local_e8.d.d = (Data *)0x0;
  local_e8.d.ptr = (char16_t *)0x0;
  QSqlError::QSqlError(&local_b0,&local_c8,(QString *)(local_60 + 8),StatementError,&local_e8);
  QVar1.d.ptr = (totally_ordered_wrapper<QSqlErrorPrivate_*>)
                (this_01->super_QSqlQueryModelPrivate).error.d.d.ptr;
  (this_01->super_QSqlQueryModelPrivate).error.d.d.ptr = (QSqlErrorPrivate *)local_b0.d.d.ptr;
  local_b0.d.d.ptr =
       (QExplicitlySharedDataPointer<QSqlErrorPrivate>)
       (QExplicitlySharedDataPointer<QSqlErrorPrivate>)QVar1.d.ptr;
  QSqlError::~QSqlError(&local_b0);
  if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_60._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_60._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_60._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_60._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_60._8_8_,2,0x10);
    }
  }
  if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,0x10);
    }
  }
  bVar2 = false;
LAB_0013ab3c:
  if (local_a8 != (QArrayData *)0x0) {
    LOCK();
    (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_a8,2,0x10);
    }
  }
  if (local_88 != (QArrayData *)0x0) {
    LOCK();
    (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_88,2,0x10);
    }
  }
  QSqlRecord::~QSqlRecord((QSqlRecord *)local_68);
  QSqlRecord::~QSqlRecord((QSqlRecord *)(local_68 + 8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QSqlTableModel::updateRowInTable(int row, const QSqlRecord &values)
{
    Q_D(QSqlTableModel);
    QSqlRecord rec(values);
    emit beforeUpdate(row, rec);

    const QSqlRecord whereValues = primaryValues(row);
    const bool prepStatement = d->db.driver()->hasFeature(QSqlDriver::PreparedQueries);
    const QString stmt = d->db.driver()->sqlStatement(QSqlDriver::UpdateStatement, d->tableName,
                                                     rec, prepStatement);
    const QString where = d->db.driver()->sqlStatement(QSqlDriver::WhereStatement, d->tableName,
                                                       whereValues, prepStatement);

    if (stmt.isEmpty() || where.isEmpty() || row < 0 || row >= rowCount()) {
        d->error = QSqlError("No Fields to update"_L1, QString(), QSqlError::StatementError);
        return false;
    }

    return d->exec(SqlTm::concat(stmt, where), prepStatement, rec, whereValues);
}